

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

void __thiscall despot::QNode::QNode(QNode *this,VNode *parent,int edge)

{
  _Rb_tree_header *p_Var1;
  
  this->parent_ = parent;
  this->edge_ = edge;
  p_Var1 = &(this->children_)._M_t._M_impl.super__Rb_tree_header;
  (this->children_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->children_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->children_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->children_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->children_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->vstar = (VNode *)0x0;
  return;
}

Assistant:

QNode::QNode(VNode* parent, int edge) :
	parent_(parent),
	edge_(edge),
	vstar(NULL) {
}